

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> * __thiscall
chaiscript::dispatch::detail::
build_param_type_list<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
          (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
           *__return_storage_ptr__,detail *this,
          _func_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
          *param_1)

{
  initializer_list<chaiscript::Type_Info> __l;
  allocator_type local_39;
  Type_Info local_38;
  pointer_____offset_0x10___ *local_20;
  pointer_____offset_0x10___ *local_18;
  uint local_10;
  
  local_38.m_type_info =
       (type_info *)&std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>::typeinfo;
  local_38.m_bare_type_info = (type_info *)&Proxy_Function_Base::typeinfo;
  local_38.m_flags = 1;
  local_20 = &std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>::typeinfo;
  local_18 = &Proxy_Function_Base::typeinfo;
  __l._M_len = 2;
  __l._M_array = &local_38;
  local_10 = local_38.m_flags;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (__return_storage_ptr__,__l,&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Type_Info> build_param_type_list(Ret (*)(Params...))
        {
          /// \note somehow this is responsible for a large part of the code generation
          return { user_type<Ret>(), user_type<Params>()... };
        }